

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

vector<unsigned_int,_std::allocator<unsigned_int>_> *
Image_Function_Helper::Histogram(HistogramForm8 histogram,Image *image,Image *mask)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined8 in_RCX;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  ImageTemplate<unsigned_char> *in_RDI;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *histogramTable;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  ImageTemplate<unsigned_char> *pIVar3;
  
  pIVar3 = in_RDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_RDI,(ImageTemplate<unsigned_char> *)
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x11ea49);
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  (*in_RSI)(in_RDX,0,0,in_RCX,0,0,uVar1,uVar2,in_RDI);
  return (vector<unsigned_int,_std::allocator<unsigned_int>_> *)pIVar3;
}

Assistant:

std::vector < uint32_t > Histogram( FunctionTable::HistogramForm8 histogram,
                                        const Image & image, const Image & mask )
    {
        Image_Function::ParameterValidation( image, mask );

        std::vector < uint32_t > histogramTable;

        histogram( image, 0, 0, mask, 0, 0, image.width(), image.height(), histogramTable );

        return histogramTable;
    }